

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O2

Token * __thiscall slang::syntax::SyntaxNode::getFirstTokenPtr(SyntaxNode *this)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Token *pTVar3;
  undefined1 extraout_DL;
  char extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 uVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 uVar5;
  size_t i;
  SyntaxNode *this_00;
  _Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> local_38 [2];
  
  pSVar1 = (SyntaxNode *)getChildCount(this);
  this_00 = (SyntaxNode *)0x0;
  uVar4 = extraout_DL;
  uVar5 = extraout_var;
  do {
    if (pSVar1 == this_00) {
      return (Token *)0x0;
    }
    local_38[0] = (_Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>)
                  getChildPtr((PtrTokenOrSyntax *)this,this_00,CONCAT71(uVar5,uVar4));
    if (extraout_DL_00 == '\0') {
      pTVar3 = PtrTokenOrSyntax::token((PtrTokenOrSyntax *)&local_38[0]._M_first);
      uVar4 = extraout_DL_03;
      uVar5 = extraout_var_02;
      if (pTVar3 != (Token *)0x0) {
        pTVar3 = PtrTokenOrSyntax::token((PtrTokenOrSyntax *)&local_38[0]._M_first);
        return pTVar3;
      }
    }
    else {
      pSVar2 = PtrTokenOrSyntax::node((PtrTokenOrSyntax *)&local_38[0]._M_first);
      uVar4 = extraout_DL_01;
      uVar5 = extraout_var_00;
      if (pSVar2 != (SyntaxNode *)0x0) {
        pSVar2 = PtrTokenOrSyntax::node((PtrTokenOrSyntax *)&local_38[0]._M_first);
        pTVar3 = getFirstTokenPtr(pSVar2);
        uVar4 = extraout_DL_02;
        uVar5 = extraout_var_01;
        if (pTVar3 != (Token *)0x0) {
          return pTVar3;
        }
      }
    }
    this_00 = (SyntaxNode *)((long)&this_00->kind + 1);
  } while( true );
}

Assistant:

parsing::Token* SyntaxNode::getFirstTokenPtr() {
    size_t childCount = getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        auto child = getChildPtr(i);
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getFirstTokenPtr();
            if (result)
                return result;
        }
    }
    return nullptr;
}